

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.h
# Opt level: O2

void __thiscall
kj::_::Debug::Fault::
Fault<kj::Exception::Type,kj::_::DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,true,true>&,std::__detail::_Node_iterator<kj::StringPtr,true,true>>&>
          (Fault *this,char *file,char line [7],Type code,char *condition,char *macroArgs,
          DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_&,_std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_>
          *params)

{
  char argValues [1] [7];
  Array<char> local_48;
  
  this->exception = (Exception *)0x0;
  str<kj::_::DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,true,true>&,std::__detail::_Node_iterator<kj::StringPtr,true,true>>&>
            ((DebugComparison<std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_&,_std::__detail::_Node_iterator<kj::StringPtr,_true,_true>_>
              *)&local_48);
  init(this,(EVP_PKEY_CTX *)file);
  Array<char>::~Array(&local_48);
  return;
}

Assistant:

Debug::Fault::Fault(const char* file, int line, Code code,
                    const char* condition, const char* macroArgs, Params&&... params)
    : exception(nullptr) {
  String argValues[sizeof...(Params)] = {str(params)...};
  init(file, line, code, condition, macroArgs,
       arrayPtr(argValues, sizeof...(Params)));
}